

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::NamedBase::AddDescriptionPostfix
          (NamedBase *this,string *dest,bool isManual,string *manual,bool isGenerated,
          string *generated,string *str)

{
  byte bVar1;
  string *in_RCX;
  byte in_DL;
  string *in_RSI;
  byte in_R8B;
  string *in_R9;
  
  if (((in_DL & 1) == 0) || (bVar1 = std::__cxx11::string::empty(), (bVar1 & 1) != 0)) {
    if ((((in_DL & 1) == 0) && ((in_R8B & 1) != 0)) &&
       (bVar1 = std::__cxx11::string::empty(), (bVar1 & 1) == 0)) {
      std::__cxx11::string::operator+=(in_RSI,(string *)generated);
      std::__cxx11::string::operator+=(in_RSI,in_R9);
    }
  }
  else {
    std::__cxx11::string::operator+=(in_RSI,(string *)generated);
    std::__cxx11::string::operator+=(in_RSI,in_RCX);
  }
  return;
}

Assistant:

void AddDescriptionPostfix(std::string &dest, const bool isManual, const std::string &manual, bool isGenerated, const std::string &generated, const std::string &str) const
            {
                if (isManual && !manual.empty())
                {
                    dest += str;
                    dest += manual;
                }
                else if (!isManual && isGenerated && !generated.empty())
                {
                    dest += str;
                    dest += generated;
                }
            }